

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_typed_attr<tinyusdz::Token>
                   (string *__return_storage_ptr__,TypedAttribute<tinyusdz::Token> *attr,
                   string *name,uint32_t indent)

{
  char *pcVar1;
  Path *v;
  string *psVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t n_01;
  optional<tinyusdz::Token> pv;
  stringstream ss;
  undefined1 local_208 [8];
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  indent_00 = indent;
  local_1e0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (((((attr->_attrib).has_value_ != false) ||
       ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start)) || (attr->_value_empty != false)) ||
     (attr->_blocked == true)) {
    bVar3 = AttrMetas::authored(&attr->_metas);
    if (((bVar3) || (attr->_blocked != false)) ||
       (((attr->_attrib).has_value_ != false ||
        (n_01 = n,
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start)))) {
      pprint::Indent_abi_cxx11_((string *)local_208,(pprint *)(ulong)indent,n);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_208,local_200._0_8_);
      pcVar1 = local_200 + 8;
      if (local_208 != (undefined1  [8])pcVar1) {
        operator_delete((void *)local_208,
                        CONCAT26(local_200._14_2_,CONCAT24(local_200._12_2_,local_200._8_4_)) + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform ",8);
      local_200._8_4_ = 0x656b6f74;
      local_200._12_2_ = 0x6e;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x5;
      local_208 = (undefined1  [8])pcVar1;
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar1,5);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(name->_M_dataplus)._M_p,name->_M_string_length);
      if (local_208 != (undefined1  [8])pcVar1) {
        operator_delete((void *)local_208,
                        CONCAT26(local_200._14_2_,CONCAT24(local_200._12_2_,local_200._8_4_)) + 1);
      }
      if (attr->_blocked == true) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
      }
      else if ((((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_finish !=
                 (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_start) || ((attr->_attrib).has_value_ != false))
              || (attr->_value_empty == false)) {
        bVar3 = (attr->_attrib).has_value_;
        local_208[0] = bVar3;
        if (bVar3 == true) {
          local_200._0_8_ = &local_1f0;
          lVar5 = *(long *)&(attr->_attrib).contained;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_200,lVar5,
                     *(long *)((long)&(attr->_attrib).contained + 8) + lVar5);
        }
        if (local_208[0] == '\x01') {
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
          if (local_208[0] == '\0') {
            __assert_fail("has_value()",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                          ,0x591,
                          "value_type &nonstd::optional_lite::optional<tinyusdz::Token>::value() [T = tinyusdz::Token]"
                         );
          }
          ::std::operator<<(local_1a8,(token *)local_200);
        }
        if ((local_208[0] == '\x01') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._0_8_ != &local_1f0)) {
          operator_delete((void *)local_200._0_8_,local_1f0._M_allocated_capacity + 1);
        }
      }
      bVar3 = AttrMetas::authored(&attr->_metas);
      if (bVar3) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
        print_attr_metas_abi_cxx11_
                  ((string *)local_208,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)local_208,local_200._0_8_);
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
        poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if (local_208 != (undefined1  [8])(local_200 + 8)) {
          operator_delete((void *)local_208,
                          CONCAT26(local_200._14_2_,CONCAT24(local_200._12_2_,local_200._8_4_)) + 1)
          ;
        }
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX;
    }
    if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pprint::Indent_abi_cxx11_((string *)local_208,(pprint *)(ulong)indent,n_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_208,local_200._0_8_);
      pcVar1 = local_200 + 8;
      if (local_208 != (undefined1  [8])pcVar1) {
        operator_delete((void *)local_208,
                        CONCAT26(local_200._14_2_,CONCAT24(local_200._12_2_,local_200._8_4_)) + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform ",8);
      local_200._8_4_ = 0x656b6f74;
      local_200._12_2_ = 0x6e;
      local_200._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x5;
      local_208 = (undefined1  [8])pcVar1;
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar1,5);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,(name->_M_dataplus)._M_p,name->_M_string_length);
      if (local_208 != (undefined1  [8])pcVar1) {
        operator_delete((void *)local_208,
                        CONCAT26(local_200._14_2_,CONCAT24(local_200._12_2_,local_200._8_4_)) + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
      v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
          .super__Vector_impl_data._M_start;
      lVar5 = ((long)(attr->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
      if (lVar5 == 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
      }
      else if (lVar5 == 1) {
        ::std::operator<<(local_1a8,v);
      }
      else {
        ::std::operator<<(local_1a8,&attr->_paths);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
  }
  psVar2 = local_1e0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    if (attr.metas().authored() || attr.is_blocked() || attr.has_value() || attr.is_value_empty() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (attr.is_value_empty()) {
        // nothing to do
      } else {
        auto pv = attr.get_value();
        if (pv) {
          ss << " = " << pv.value();
        }
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }
  }

  return ss.str();
}